

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensors.cpp
# Opt level: O2

bool __thiscall
iDynTree::SensorsList::removeSensor
          (SensorsList *this,SensorType *sensor_type,ptrdiff_t sensor_index)

{
  const_iterator __position;
  SensorType SVar1;
  pointer pvVar2;
  long lVar3;
  pointer ppSVar4;
  ulong uVar5;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
  *this_00;
  vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> *this_01;
  long lVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  Sensor *local_70;
  long local_68;
  ptrdiff_t local_60;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  local_58;
  
  SVar1 = *sensor_type;
  pvVar2 = (this->pimpl->allSensors).
           super__Vector_base<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&pvVar2[SVar1].
                    super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>.
                    _M_impl;
  lVar6 = (long)pvVar2[SVar1].
                super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>._M_impl.
                super__Vector_impl_data._M_finish - lVar3 >> 3;
  if (sensor_index < lVar6) {
    this_01 = pvVar2 + SVar1;
    __position._M_current = (Sensor **)(lVar3 + sensor_index * 8);
    local_70 = *__position._M_current;
    local_68 = lVar6;
    local_60 = sensor_index;
    std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>::erase(this_01,__position);
    this_00 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
               *)((this->pimpl->sensorsNameToIndex).
                  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + *sensor_type);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
    ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             *)this_00);
    uVar5 = 0;
    while( true ) {
      sensor_index = local_60;
      lVar6 = local_68;
      ppSVar4 = (this_01->
                super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>)._M_impl
                .super__Vector_impl_data._M_start;
      if ((ulong)((long)(this_01->
                        super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>)
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar4 >> 3) <= uVar5)
      break;
      (*ppSVar4[uVar5]->_vptr_Sensor[2])((string *)&local_90);
      local_58.first._M_string_length = local_88;
      local_58.first._M_dataplus._M_p = (pointer)&local_58.first.field_2;
      if (local_90 == &local_80) {
        local_58.first.field_2._8_8_ = local_80._8_8_;
      }
      else {
        local_58.first._M_dataplus._M_p = (pointer)local_90;
      }
      local_58.first.field_2._M_allocated_capacity._1_7_ = local_80._M_allocated_capacity._1_7_;
      local_58.first.field_2._M_local_buf[0] = local_80._M_local_buf[0];
      local_88 = 0;
      local_80._M_local_buf[0] = '\0';
      local_90 = &local_80;
      local_58.second = uVar5;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
      ::_M_insert_unique<std::pair<std::__cxx11::string_const,long>>(this_00,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_90);
      uVar5 = uVar5 + 1;
    }
    if (local_70 != (Sensor *)0x0) {
      (*local_70->_vptr_Sensor[1])();
    }
  }
  return sensor_index < lVar6;
}

Assistant:

bool SensorsList::removeSensor(const SensorType & sensor_type, const std::ptrdiff_t sensor_index)
    {
        std::vector<Sensor*>& typeVector = this->pimpl->allSensors[sensor_type];
        if (sensor_index >= static_cast<std::ptrdiff_t>(typeVector.size())) {
            return false;
        }
        Sensor *s = typeVector[sensor_index];
        typeVector.erase(typeVector.begin() + sensor_index);
        SensorsListPimpl::SensorNameToIndexMap& nameToIndex = this->pimpl->sensorsNameToIndex[sensor_type];
        // We have to rebuild the name->index map as indices have changed
        nameToIndex.clear();
        for (size_t index = 0; index < typeVector.size(); ++index) {
            nameToIndex.insert(SensorsListPimpl::SensorNameToIndexMap::value_type(typeVector[index]->getName(), index));
        }

        delete s;
        return true;
    }